

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O0

void xmrig::cryptonight_quad_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  __m128i bx0;
  __m128i bx0_00;
  __m128i bx0_01;
  __m128i bx0_02;
  __m128i bx1;
  __m128i bx1_00;
  __m128i bx1_01;
  __m128i bx1_02;
  uint32_t uVar4;
  uint uVar5;
  uint64_t *mem_out;
  uint64_t *mem_out_00;
  uint64_t *mem_out_01;
  ulong *puVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong b;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long *in_RCX;
  long in_RDX;
  longlong in_R8;
  __m128i *in_R9;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i ax0_00;
  __m128i ax0_01;
  __m128i ax0_02;
  __m128i ax0_03;
  size_t i_2;
  __m128i chunk3_3;
  __m128i chunk2_3;
  __m128i chunk1_3;
  uint64_t division_result_3;
  uint64_t cx_1_3;
  uint32_t d_3;
  uint64_t cx_0_3;
  uint64_t sqrt_result_3;
  __m128i chunk3_2;
  __m128i chunk2_2;
  __m128i chunk1_2;
  uint64_t division_result_2;
  uint64_t cx_1_2;
  uint32_t d_2;
  uint64_t cx_0_2;
  uint64_t sqrt_result_2;
  __m128i chunk3_1;
  __m128i chunk2_1;
  __m128i chunk1_1;
  uint64_t division_result_1;
  uint64_t cx_1_1;
  uint32_t d_1;
  uint64_t cx_0_1;
  uint64_t sqrt_result_1;
  __m128i chunk3;
  __m128i chunk2;
  __m128i chunk1;
  uint64_t division_result;
  uint64_t cx_1;
  uint32_t d;
  uint64_t cx_0;
  uint64_t sqrt_result;
  uint64_t ch3;
  uint64_t cl3;
  uint64_t ch2;
  uint64_t cl2;
  uint64_t ch1;
  uint64_t cl1;
  uint64_t ch0;
  uint64_t cl0;
  __m128i *ptr3;
  __m128i *ptr2;
  __m128i *ptr1;
  __m128i *ptr0;
  uint64_t lo;
  uint64_t hi;
  size_t i_1;
  uint64_t idx3;
  uint64_t idx2;
  uint64_t idx1;
  uint64_t idx0;
  __m128i cx3;
  __m128i bx31;
  __m128i bx30;
  __m128i ax3;
  __m128i sqrt_result_xmm_3;
  __m128i division_result_xmm_3;
  __m128i cx2;
  __m128i bx21;
  __m128i bx20;
  __m128i ax2;
  __m128i sqrt_result_xmm_2;
  __m128i division_result_xmm_2;
  __m128i cx1;
  __m128i bx11;
  __m128i bx10;
  __m128i ax1;
  __m128i sqrt_result_xmm_1;
  __m128i division_result_xmm_1;
  __m128i cx0;
  __m128i bx01;
  __m128i bx00;
  __m128i ax0;
  __m128i sqrt_result_xmm_0;
  __m128i division_result_xmm_0;
  uint64_t *h3;
  uint64_t *h2;
  uint64_t *h1;
  uint64_t *h0;
  uint8_t *l3;
  uint8_t *l2;
  uint8_t *l1;
  uint8_t *l0;
  size_t i;
  uint32_t iters;
  size_t MASK;
  uint32_t y3_3;
  uint32_t y2_3;
  uint32_t y1_3;
  uint32_t y0_3;
  uint32_t x3_3;
  uint32_t x2_3;
  uint32_t x1_3;
  uint32_t x0_3;
  uint32_t y3_2;
  uint32_t y2_2;
  uint32_t y1_2;
  uint32_t y0_2;
  uint32_t x3_2;
  uint32_t x2_2;
  uint32_t x1_2;
  uint32_t x0_2;
  uint32_t y3_1;
  uint32_t y2_1;
  uint32_t y1_1;
  uint32_t y0_1;
  uint32_t x3_1;
  uint32_t x2_1;
  uint32_t x1_1;
  uint32_t x0_1;
  uint32_t y3;
  uint32_t y2;
  uint32_t y1;
  uint32_t y0;
  uint32_t x3;
  uint32_t x2;
  uint32_t x1;
  uint32_t x0;
  size_t in_stack_ffffffffffffedc8;
  uint32_t (*pauVar13) [256];
  uint8_t *in_stack_ffffffffffffedd0;
  ulong uVar14;
  long in_stack_ffffffffffffedd8;
  long in_stack_ffffffffffffede0;
  int local_11d8;
  int local_11d0;
  int local_1178;
  int local_1170;
  int local_1118;
  int local_1110;
  __m128i *in_stack_ffffffffffffef20;
  __m128i *in_stack_ffffffffffffef28;
  int local_10b8;
  ulong local_1048;
  ulong local_1040;
  ulong local_1038;
  ulong local_1030;
  ulong local_1028;
  ulong local_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  ulong local_1008;
  ulong uStack_1000;
  ulong local_ff8;
  ulong uStack_ff0;
  ulong local_fe8;
  ulong uStack_fe0;
  ulong local_fd8;
  undefined8 uStack_fd0;
  ulong local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  ulong local_fa8;
  ulong uStack_fa0;
  ulong local_f98;
  ulong uStack_f90;
  ulong local_f88;
  ulong uStack_f80;
  ulong local_f78;
  undefined8 uStack_f70;
  ulong local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  ulong local_f48;
  ulong uStack_f40;
  ulong local_f38;
  ulong uStack_f30;
  ulong local_f28;
  ulong uStack_f20;
  ulong local_f18;
  undefined8 uStack_f10;
  ulong local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  ulong local_ee8;
  ulong uStack_ee0;
  ulong local_ed8;
  ulong uStack_ed0;
  ulong local_ec8;
  ulong uStack_ec0;
  ulong local_eb8;
  undefined8 uStack_eb0;
  __m128i *local_ea8;
  undefined8 uStack_ea0;
  ulong *local_e98;
  ulong *local_e90;
  ulong *local_e88;
  ulong *local_e80;
  uint8_t *local_e78;
  uint8_t *local_e70;
  uint8_t *local_e68;
  uint8_t *local_e60;
  ulong local_e58;
  uint local_e4c;
  undefined8 local_e48;
  __m128i *local_e40;
  long *local_e30;
  long local_e28;
  uint local_e10;
  uint local_e0c;
  uint local_e08;
  uint local_e04;
  uint local_e00;
  uint local_dfc;
  uint local_df8;
  uint local_df4;
  uint32_t (*local_df0) [256];
  ulong local_de8;
  ulong uStack_de0;
  undefined8 *local_dd8;
  uint local_dd0;
  uint local_dcc;
  uint local_dc8;
  uint local_dc4;
  uint local_dc0;
  uint local_dbc;
  uint local_db8;
  uint local_db4;
  uint32_t (*local_db0) [256];
  ulong local_da8;
  ulong uStack_da0;
  undefined8 *local_d98;
  uint local_d90;
  uint local_d8c;
  uint local_d88;
  uint local_d84;
  uint local_d80;
  uint local_d7c;
  uint local_d78;
  uint local_d74;
  uint32_t (*local_d70) [256];
  ulong local_d68;
  ulong uStack_d60;
  undefined8 *local_d58;
  uint local_d50;
  uint local_d4c;
  uint local_d48;
  uint local_d44;
  uint local_d40;
  uint local_d3c;
  uint local_d38;
  uint local_d34;
  undefined8 local_d30;
  ulong local_d28;
  ulong uStack_d20;
  undefined8 *local_d10;
  ulong local_d08;
  ulong uStack_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  ulong local_cd8;
  ulong uStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  ulong local_c98;
  ulong uStack_c90;
  ulong local_c88;
  ulong uStack_c80;
  ulong local_c78;
  ulong uStack_c70;
  ulong local_c68;
  uint64_t uStack_c60;
  ulong local_c58;
  ulong uStack_c50;
  ulong local_c48;
  ulong uStack_c40;
  ulong local_c38;
  ulong uStack_c30;
  ulong local_c28;
  uint64_t uStack_c20;
  ulong local_c18;
  ulong uStack_c10;
  ulong local_c08;
  ulong uStack_c00;
  ulong local_bf8;
  ulong uStack_bf0;
  ulong local_be8;
  uint64_t uStack_be0;
  ulong local_bd8;
  ulong uStack_bd0;
  ulong local_bc8;
  ulong uStack_bc0;
  ulong local_bb8;
  ulong uStack_bb0;
  ulong local_ba8;
  uint64_t uStack_ba0;
  ulong local_b98;
  ulong uStack_b90;
  ulong local_b88;
  ulong uStack_b80;
  uint local_b78;
  uint local_b74;
  uint local_b70;
  uint local_b6c;
  ulong local_b68;
  ulong uStack_b60;
  uint local_b58;
  uint local_b54;
  uint local_b50;
  uint local_b4c;
  ulong local_b48;
  ulong uStack_b40;
  uint local_b38;
  uint local_b34;
  uint local_b30;
  uint local_b2c;
  ulong local_b28;
  ulong uStack_b20;
  uint local_b18;
  uint local_b14;
  uint local_b10;
  uint local_b0c;
  ulong local_b08;
  undefined8 uStack_b00;
  ulong local_af0;
  ulong local_ae8;
  undefined8 uStack_ae0;
  ulong local_ad0;
  ulong local_ac8;
  undefined8 uStack_ac0;
  ulong local_ab0;
  __m128i *local_aa8;
  undefined8 uStack_aa0;
  __m128i *local_a90;
  ulong local_a88;
  undefined8 uStack_a80;
  ulong local_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  ulong local_a50;
  ulong local_a48;
  undefined8 uStack_a40;
  ulong local_a30;
  ulong local_a28;
  undefined8 uStack_a20;
  ulong local_a10;
  ulong local_a08;
  undefined8 uStack_a00;
  ulong local_9f0;
  ulong local_9e8;
  undefined8 uStack_9e0;
  ulong local_9d0;
  ulong local_9c8;
  undefined8 uStack_9c0;
  ulong local_9b0;
  __m128i *local_9a8;
  undefined8 uStack_9a0;
  __m128i *local_990;
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong local_970;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong local_950;
  ulong local_948;
  uint64_t uStack_940;
  ulong local_938;
  uint64_t local_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong local_910;
  ulong local_908;
  ulong uStack_900;
  ulong local_8f8;
  ulong local_8f0;
  ulong local_8e8;
  uint64_t uStack_8e0;
  ulong local_8d8;
  uint64_t local_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  ulong local_8b8;
  ulong local_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  ulong local_898;
  ulong local_890;
  ulong local_888;
  uint64_t uStack_880;
  ulong local_878;
  uint64_t local_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong local_850;
  ulong local_848;
  ulong uStack_840;
  ulong local_838;
  ulong local_830;
  ulong local_828;
  uint64_t uStack_820;
  ulong local_818;
  uint64_t local_810;
  ulong local_808;
  ulong uStack_800;
  ulong local_7f8;
  ulong local_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  ulong local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  ulong local_798;
  ulong local_790;
  ulong local_788;
  ulong uStack_780;
  ulong local_778;
  ulong local_770;
  ulong local_768;
  ulong uStack_760;
  ulong local_758;
  ulong local_750;
  ulong local_748;
  ulong uStack_740;
  ulong local_738;
  ulong local_730;
  ulong local_728;
  ulong uStack_720;
  ulong local_718;
  ulong local_710;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  ulong local_6d8;
  ulong local_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  ulong local_698;
  ulong local_690;
  long *local_688;
  long *local_680;
  ulong *local_678;
  long *local_670;
  long *local_668;
  ulong *local_660;
  long *local_658;
  long *local_650;
  ulong *local_648;
  long *local_640;
  long *local_638;
  ulong *local_630;
  uint64_t *local_628;
  uint64_t *local_620;
  uint64_t *local_618;
  uint64_t *local_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  undefined8 uStack_5f0;
  ulong local_5e8;
  undefined8 uStack_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  ulong local_5c8;
  undefined8 uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  ulong local_5a8;
  undefined8 uStack_5a0;
  ulong local_598;
  undefined8 uStack_590;
  ulong local_588;
  ulong uStack_580;
  ulong local_578;
  undefined8 uStack_570;
  ulong local_568;
  ulong uStack_560;
  ulong local_558;
  undefined8 uStack_550;
  ulong local_548;
  undefined8 uStack_540;
  ulong local_538;
  ulong uStack_530;
  ulong local_528;
  undefined8 uStack_520;
  ulong local_518;
  ulong uStack_510;
  ulong local_508;
  undefined8 uStack_500;
  __m128i *local_4f8;
  undefined8 uStack_4f0;
  ulong local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  undefined8 uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong local_4a8;
  ulong uStack_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  ulong local_478;
  ulong uStack_470;
  ulong local_468;
  ulong uStack_460;
  ulong local_458;
  ulong uStack_450;
  ulong local_448;
  ulong uStack_440;
  ulong *local_430;
  long local_428;
  long lStack_420;
  long *local_410;
  long local_408;
  long lStack_400;
  long *local_3f0;
  long local_3e8;
  long lStack_3e0;
  long *local_3d0;
  ulong local_3c8;
  ulong uStack_3c0;
  ulong *local_3b0;
  long local_3a8;
  long lStack_3a0;
  long *local_390;
  long local_388;
  long lStack_380;
  long *local_370;
  long local_368;
  long lStack_360;
  long *local_350;
  ulong local_348;
  ulong uStack_340;
  ulong *local_330;
  long local_328;
  long lStack_320;
  long *local_310;
  long local_308;
  long lStack_300;
  long *local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong *local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_290;
  long local_288;
  long lStack_280;
  long *local_270;
  long local_268;
  long lStack_260;
  long *local_250;
  ulong local_248;
  ulong uStack_240;
  ulong local_238;
  ulong uStack_230;
  ulong local_228;
  ulong uStack_220;
  long local_218;
  long lStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  long local_1d8;
  long lStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  long local_198;
  long lStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  long local_158;
  long lStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  long local_118;
  long lStack_110;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  long local_d8;
  long lStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  long local_98;
  long lStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  __m128i *palStack_70;
  ulong local_68;
  ulong uStack_60;
  long local_58;
  long lStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_e48 = 0xffff0;
  local_e40 = in_R9;
  local_e30 = in_RCX;
  local_e28 = in_RDX;
  uVar4 = CnAlgo::iterations((CnAlgo *)
                             &cryptonight_quad_hash<true>(unsigned_char_const*,unsigned_long,unsigned_char*,cryptonight_ctx**,unsigned_long,unsigned_long)
                              ::props);
  local_e4c = (uint)((long)*local_e40 + (ulong)uVar4 >> 1);
  for (local_e58 = 0; local_e58 < 4; local_e58 = local_e58 + 1) {
    keccak(in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,(uint8_t *)0x268dbb);
    cn_explode_scratchpad<true>(in_stack_ffffffffffffef28,in_stack_ffffffffffffef20);
  }
  local_e60 = *(uint8_t **)(*local_e30 + 0xe0);
  local_e68 = *(uint8_t **)(local_e30[1] + 0xe0);
  local_e70 = *(uint8_t **)(local_e30[2] + 0xe0);
  local_e78 = *(uint8_t **)(local_e30[3] + 0xe0);
  local_e80 = (ulong *)*local_e30;
  local_e88 = (ulong *)local_e30[1];
  local_e90 = (ulong *)local_e30[2];
  local_e98 = (ulong *)local_e30[3];
  local_ea8 = (__m128i *)local_e80[0xc];
  uStack_9a0 = 0;
  uStack_ea0 = 0;
  local_eb8 = local_e80[0xd];
  uStack_9c0 = 0;
  uStack_eb0 = 0;
  uStack_ec0 = local_e80[1] ^ local_e80[5];
  local_ec8 = *local_e80 ^ local_e80[4];
  uStack_ed0 = local_e80[3] ^ local_e80[7];
  local_ed8 = local_e80[2] ^ local_e80[6];
  uStack_ee0 = local_e80[9] ^ local_e80[0xb];
  local_ee8 = local_e80[8] ^ local_e80[10];
  local_18 = 0;
  uStack_10 = 0;
  local_ef8 = 0;
  uStack_ef0 = 0;
  local_f08 = local_e88[0xc];
  uStack_9e0 = 0;
  uStack_f00 = 0;
  local_f18 = local_e88[0xd];
  uStack_a00 = 0;
  uStack_f10 = 0;
  uStack_f20 = local_e88[1] ^ local_e88[5];
  local_f28 = *local_e88 ^ local_e88[4];
  uStack_f30 = local_e88[3] ^ local_e88[7];
  local_f38 = local_e88[2] ^ local_e88[6];
  uStack_f40 = local_e88[9] ^ local_e88[0xb];
  local_f48 = local_e88[8] ^ local_e88[10];
  local_28 = 0;
  uStack_20 = 0;
  local_f58 = 0;
  uStack_f50 = 0;
  local_f68 = local_e90[0xc];
  uStack_a20 = 0;
  uStack_f60 = 0;
  local_f78 = local_e90[0xd];
  uStack_a40 = 0;
  uStack_f70 = 0;
  uStack_f80 = local_e90[1] ^ local_e90[5];
  local_f88 = *local_e90 ^ local_e90[4];
  uStack_f90 = local_e90[3] ^ local_e90[7];
  local_f98 = local_e90[2] ^ local_e90[6];
  uStack_fa0 = local_e90[9] ^ local_e90[0xb];
  local_fa8 = local_e90[8] ^ local_e90[10];
  local_38 = 0;
  uStack_30 = 0;
  local_fb8 = 0;
  uStack_fb0 = 0;
  local_fc8 = local_e98[0xc];
  uStack_a60 = 0;
  uStack_fc0 = 0;
  local_fd8 = local_e98[0xd];
  uStack_a80 = 0;
  uStack_fd0 = 0;
  uStack_fe0 = local_e98[1] ^ local_e98[5];
  local_fe8 = *local_e98 ^ local_e98[4];
  uStack_ff0 = local_e98[3] ^ local_e98[7];
  local_ff8 = local_e98[2] ^ local_e98[6];
  uStack_1000 = local_e98[9] ^ local_e98[0xb];
  local_1008 = local_e98[8] ^ local_e98[10];
  local_48 = 0;
  uStack_40 = 0;
  local_1018 = 0;
  uStack_1010 = 0;
  local_a88 = local_fd8;
  local_a70 = local_fd8;
  local_a68 = local_fc8;
  local_a50 = local_fc8;
  local_a48 = local_f78;
  local_a30 = local_f78;
  local_a28 = local_f68;
  local_a10 = local_f68;
  local_a08 = local_f18;
  local_9f0 = local_f18;
  local_9e8 = local_f08;
  local_9d0 = local_f08;
  local_9c8 = local_eb8;
  local_9b0 = local_eb8;
  local_9a8 = local_ea8;
  local_990 = local_ea8;
  local_808 = local_1008;
  uStack_800 = uStack_1000;
  local_7f8 = local_1008;
  local_7f0 = uStack_1000;
  local_7e8 = local_ff8;
  uStack_7e0 = uStack_ff0;
  local_7d8 = local_ff8;
  local_7d0 = uStack_ff0;
  local_7c8 = local_fe8;
  uStack_7c0 = uStack_fe0;
  local_7b8 = local_fe8;
  local_7b0 = uStack_fe0;
  local_7a8 = local_fa8;
  uStack_7a0 = uStack_fa0;
  local_798 = local_fa8;
  local_790 = uStack_fa0;
  local_788 = local_f98;
  uStack_780 = uStack_f90;
  local_778 = local_f98;
  local_770 = uStack_f90;
  local_768 = local_f88;
  uStack_760 = uStack_f80;
  local_758 = local_f88;
  local_750 = uStack_f80;
  local_748 = local_f48;
  uStack_740 = uStack_f40;
  local_738 = local_f48;
  local_730 = uStack_f40;
  local_728 = local_f38;
  uStack_720 = uStack_f30;
  local_718 = local_f38;
  local_710 = uStack_f30;
  local_708 = local_f28;
  uStack_700 = uStack_f20;
  local_6f8 = local_f28;
  local_6f0 = uStack_f20;
  local_6e8 = local_ee8;
  uStack_6e0 = uStack_ee0;
  local_6d8 = local_ee8;
  local_6d0 = uStack_ee0;
  local_6c8 = local_ed8;
  uStack_6c0 = uStack_ed0;
  local_6b8 = local_ed8;
  local_6b0 = uStack_ed0;
  local_6a8 = local_ec8;
  uStack_6a0 = uStack_ec0;
  local_698 = local_ec8;
  local_690 = uStack_ec0;
  fesetround(0x400);
  local_458 = local_ec8;
  uStack_450 = uStack_ec0;
  local_1020 = local_ec8;
  local_468 = local_f28;
  uStack_460 = uStack_f20;
  local_1028 = local_f28;
  local_478 = local_f88;
  uStack_470 = uStack_f80;
  local_1030 = local_f88;
  local_488 = local_fe8;
  uStack_480 = uStack_fe0;
  for (local_1040 = 0; local_1038 = local_fe8, local_1040 < local_e4c; local_1040 = local_1040 + 1)
  {
    local_610 = (uint64_t *)(local_e60 + ((uint)local_1020 & 0xffff0));
    uVar14 = *local_610;
    uVar10 = local_610[1];
    mem_out = (uint64_t *)(local_e68 + ((uint)local_1028 & 0xffff0));
    local_f58 = *mem_out;
    uStack_f50 = mem_out[1];
    mem_out_00 = (uint64_t *)(local_e70 + ((uint)local_1030 & 0xffff0));
    local_fb8 = *mem_out_00;
    uStack_fb0 = mem_out_00[1];
    mem_out_01 = (uint64_t *)(local_e78 + ((uint)local_fe8 & 0xffff0));
    local_1018 = *mem_out_01;
    uStack_1010 = mem_out_01[1];
    local_d10 = &local_ef8;
    local_d28 = local_ec8;
    uStack_d20 = uStack_ec0;
    pauVar13 = saes_table;
    local_ef8._0_4_ = (uint)uVar14;
    uStack_ef0._0_4_ = (uint)uVar10;
    local_d30 = 0x280d60;
    local_d3c = (uint)uStack_ef0 >> 0x18;
    local_d40 = (uint)(uVar10 >> 0x38);
    local_d34 = (uint)local_ef8 >> 0x18;
    local_d38 = (uint)(uVar14 >> 0x38);
    local_d44 = saes_table[0][uVar14 & 0xff] ^ saes_table[1][uVar14 >> 0x28 & 0xff] ^
                saes_table[2][uVar10 >> 0x10 & 0xff] ^ saes_table[2][local_d40 + 0x100];
    local_d48 = saes_table[0][uVar14 >> 0x20 & 0xff] ^ saes_table[1][uVar10 >> 8 & 0xff] ^
                saes_table[2][uVar10 >> 0x30 & 0xff] ^ saes_table[2][local_d34 + 0x100];
    local_d4c = saes_table[0][uVar10 & 0xff] ^ saes_table[1][uVar10 >> 0x28 & 0xff] ^
                saes_table[2][uVar14 >> 0x10 & 0xff] ^ saes_table[2][local_d38 + 0x100];
    local_d50 = saes_table[0][uVar10 >> 0x20 & 0xff] ^ saes_table[1][uVar14 >> 8 & 0xff] ^
                saes_table[2][uVar14 >> 0x30 & 0xff] ^ saes_table[2][local_d3c + 0x100];
    local_cf8 = CONCAT44(local_d48,local_d44);
    uStack_cf0 = CONCAT44(local_d50,local_d4c);
    local_d08 = local_ec8;
    uStack_d00 = uStack_ec0;
    local_ef8 = local_cf8 ^ local_ec8;
    uStack_ef0 = uStack_cf0 ^ uStack_ec0;
    bx0[1] = (longlong)in_stack_ffffffffffffedd0;
    bx0[0] = (longlong)saes_table;
    bx1[1] = in_stack_ffffffffffffede0;
    bx1[0] = in_stack_ffffffffffffedd8;
    ax0_00[1] = in_R8;
    ax0_00[0] = (longlong)local_d10;
    local_b88 = local_cf8;
    uStack_b80 = uStack_cf0;
    local_b78 = local_d44;
    local_b74 = local_d48;
    local_b70 = local_d4c;
    local_b6c = local_d50;
    local_628 = mem_out_01;
    local_620 = mem_out_00;
    local_618 = mem_out;
    cryptonight_monero_tweak
              (local_610,local_e60,(ulong)((uint)local_1020 & 0xffff0),ax0_00,bx0,bx1,in_R9);
    local_d58 = &local_f58;
    local_d68 = local_f28;
    uStack_d60 = uStack_f20;
    local_d70 = pauVar13 + 2;
    local_d7c = (uint)uStack_f50 >> 0x18;
    local_d80 = uStack_f50._4_4_ >> 0x18;
    local_d74 = (uint)local_f58 >> 0x18;
    local_d78 = local_f58._4_4_ >> 0x18;
    local_d84 = (*pauVar13)[local_f58 & 0xff] ^ pauVar13[1][local_f58 >> 0x28 & 0xff] ^
                (*local_d70)[uStack_f50 >> 0x10 & 0xff] ^ (*local_d70)[local_d80 + 0x100];
    local_d88 = (*pauVar13)[local_f58 >> 0x20 & 0xff] ^ pauVar13[1][uStack_f50 >> 8 & 0xff] ^
                (*local_d70)[uStack_f50 >> 0x30 & 0xff] ^ (*local_d70)[local_d74 + 0x100];
    local_d8c = (*pauVar13)[uStack_f50 & 0xff] ^ pauVar13[1][uStack_f50 >> 0x28 & 0xff] ^
                (*local_d70)[local_f58 >> 0x10 & 0xff] ^ (*local_d70)[local_d78 + 0x100];
    local_d90 = (*pauVar13)[uStack_f50 >> 0x20 & 0xff] ^ pauVar13[1][local_f58 >> 8 & 0xff] ^
                (*local_d70)[local_f58 >> 0x30 & 0xff] ^ (*local_d70)[local_d7c + 0x100];
    local_cd8 = CONCAT44(local_d88,local_d84);
    uStack_cd0 = CONCAT44(local_d90,local_d8c);
    local_ce8 = local_f28;
    uStack_ce0 = uStack_f20;
    local_f58 = local_cd8 ^ local_f28;
    uStack_f50 = uStack_cd0 ^ uStack_f20;
    bx0_00[1] = (longlong)in_stack_ffffffffffffedd0;
    bx0_00[0] = (longlong)pauVar13;
    bx1_00[1] = in_stack_ffffffffffffede0;
    bx1_00[0] = in_stack_ffffffffffffedd8;
    ax0_01[1] = in_R8;
    ax0_01[0] = (longlong)local_d58;
    local_b68 = local_cd8;
    uStack_b60 = uStack_cd0;
    local_b58 = local_d84;
    local_b54 = local_d88;
    local_b50 = local_d8c;
    local_b4c = local_d90;
    cryptonight_monero_tweak
              (mem_out,local_e68,(ulong)((uint)local_1028 & 0xffff0),ax0_01,bx0_00,bx1_00,in_R9);
    local_d98 = &local_fb8;
    local_da8 = local_f88;
    uStack_da0 = uStack_f80;
    local_db0 = pauVar13 + 2;
    local_dbc = (uint)uStack_fb0 >> 0x18;
    local_dc0 = uStack_fb0._4_4_ >> 0x18;
    local_db4 = (uint)local_fb8 >> 0x18;
    local_db8 = local_fb8._4_4_ >> 0x18;
    local_dc4 = (*pauVar13)[local_fb8 & 0xff] ^ pauVar13[1][local_fb8 >> 0x28 & 0xff] ^
                (*local_db0)[uStack_fb0 >> 0x10 & 0xff] ^ (*local_db0)[local_dc0 + 0x100];
    local_dc8 = (*pauVar13)[local_fb8 >> 0x20 & 0xff] ^ pauVar13[1][uStack_fb0 >> 8 & 0xff] ^
                (*local_db0)[uStack_fb0 >> 0x30 & 0xff] ^ (*local_db0)[local_db4 + 0x100];
    local_dcc = (*pauVar13)[uStack_fb0 & 0xff] ^ pauVar13[1][uStack_fb0 >> 0x28 & 0xff] ^
                (*local_db0)[local_fb8 >> 0x10 & 0xff] ^ (*local_db0)[local_db8 + 0x100];
    local_dd0 = (*pauVar13)[uStack_fb0 >> 0x20 & 0xff] ^ pauVar13[1][local_fb8 >> 8 & 0xff] ^
                (*local_db0)[local_fb8 >> 0x30 & 0xff] ^ (*local_db0)[local_dbc + 0x100];
    local_cb8 = CONCAT44(local_dc8,local_dc4);
    uStack_cb0 = CONCAT44(local_dd0,local_dcc);
    local_cc8 = local_f88;
    uStack_cc0 = uStack_f80;
    local_fb8 = local_cb8 ^ local_f88;
    uStack_fb0 = uStack_cb0 ^ uStack_f80;
    bx0_01[1] = (longlong)in_stack_ffffffffffffedd0;
    bx0_01[0] = (longlong)pauVar13;
    bx1_01[1] = in_stack_ffffffffffffede0;
    bx1_01[0] = in_stack_ffffffffffffedd8;
    ax0_02[1] = in_R8;
    ax0_02[0] = (longlong)local_d98;
    local_b48 = local_cb8;
    uStack_b40 = uStack_cb0;
    local_b38 = local_dc4;
    local_b34 = local_dc8;
    local_b30 = local_dcc;
    local_b2c = local_dd0;
    cryptonight_monero_tweak
              (mem_out_00,local_e70,(ulong)((uint)local_1030 & 0xffff0),ax0_02,bx0_01,bx1_01,in_R9);
    local_dd8 = &local_1018;
    local_de8 = local_fe8;
    uStack_de0 = uStack_fe0;
    local_df0 = pauVar13 + 2;
    local_dfc = (uint)uStack_1010 >> 0x18;
    local_e00 = uStack_1010._4_4_ >> 0x18;
    local_df4 = (uint)local_1018 >> 0x18;
    local_df8 = local_1018._4_4_ >> 0x18;
    local_e04 = (*pauVar13)[local_1018 & 0xff] ^ pauVar13[1][local_1018 >> 0x28 & 0xff] ^
                (*local_df0)[uStack_1010 >> 0x10 & 0xff] ^ (*local_df0)[local_e00 + 0x100];
    local_e08 = (*pauVar13)[local_1018 >> 0x20 & 0xff] ^ pauVar13[1][uStack_1010 >> 8 & 0xff] ^
                (*local_df0)[uStack_1010 >> 0x30 & 0xff] ^ (*local_df0)[local_df4 + 0x100];
    local_e0c = (*pauVar13)[uStack_1010 & 0xff] ^ pauVar13[1][uStack_1010 >> 0x28 & 0xff] ^
                (*local_df0)[local_1018 >> 0x10 & 0xff] ^ (*local_df0)[local_df8 + 0x100];
    local_e10 = (*pauVar13)[uStack_1010 >> 0x20 & 0xff] ^ pauVar13[1][local_1018 >> 8 & 0xff] ^
                (*local_df0)[local_1018 >> 0x30 & 0xff] ^ (*local_df0)[local_dfc + 0x100];
    local_c98 = CONCAT44(local_e08,local_e04);
    uStack_c90 = CONCAT44(local_e10,local_e0c);
    local_ca8 = local_fe8;
    uStack_ca0 = uStack_fe0;
    local_1018 = local_c98 ^ local_fe8;
    uStack_1010 = uStack_c90 ^ uStack_fe0;
    bx0_02[1] = (longlong)in_stack_ffffffffffffedd0;
    bx0_02[0] = (longlong)pauVar13;
    bx1_02[1] = in_stack_ffffffffffffede0;
    bx1_02[0] = in_stack_ffffffffffffedd8;
    ax0_03[1] = in_R8;
    ax0_03[0] = (longlong)local_dd8;
    local_b28 = local_c98;
    uStack_b20 = uStack_c90;
    local_b18 = local_e04;
    local_b14 = local_e08;
    local_b10 = local_e0c;
    local_b0c = local_e10;
    cryptonight_monero_tweak
              (mem_out_01,local_e78,(ulong)((uint)local_1038 & 0xffff0),ax0_03,bx0_02,bx1_02,in_R9);
    local_498 = local_ef8;
    uStack_490 = uStack_ef0;
    local_1020 = local_ef8;
    puVar6 = (ulong *)(local_e60 + ((uint)local_ef8 & 0xffff0));
    uVar14 = puVar6[1];
    local_4a8 = local_f58;
    uStack_4a0 = uStack_f50;
    local_1028 = local_f58;
    puVar7 = (ulong *)(local_e68 + ((uint)local_f58 & 0xffff0));
    uVar10 = *puVar7;
    uVar1 = puVar7[1];
    local_4b8 = local_fb8;
    uStack_4b0 = uStack_fb0;
    local_1030 = local_fb8;
    puVar8 = (ulong *)(local_e70 + ((uint)local_fb8 & 0xffff0));
    uVar11 = *puVar8;
    uVar2 = puVar8[1];
    local_4c8 = local_1018;
    uStack_4c0 = uStack_1010;
    local_1038 = local_1018;
    puVar9 = (ulong *)(local_e78 + (local_1018 & 0xffff0));
    uVar12 = *puVar9;
    uVar3 = puVar9[1];
    local_4d8 = local_eb8;
    uStack_4d0 = uStack_eb0;
    local_4e8 = local_ef8;
    uStack_4e0 = uStack_ef0;
    local_4f8 = local_ea8;
    uStack_4f0 = uStack_ea0;
    b = *puVar6 ^ (ulong)local_ea8 ^ local_eb8 << 0x20;
    local_10b8 = (int)local_eb8;
    uVar5 = (uint)local_ef8 + local_10b8 * 2 | 0x80000001;
    local_508 = uStack_ef0;
    uStack_500 = 0;
    in_stack_ffffffffffffef28 =
         (__m128i *)(uStack_ef0 / uVar5 & 0xffffffff | uStack_ef0 % (ulong)uVar5 << 0x20);
    uStack_aa0 = 0;
    uStack_ea0 = 0;
    local_ea8 = in_stack_ffffffffffffef28;
    local_aa8 = in_stack_ffffffffffffef28;
    local_a90 = in_stack_ffffffffffffef28;
    int_sqrt_v2((long)*in_stack_ffffffffffffef28 + local_ef8);
    local_eb8 = extraout_XMM0_Qa;
    uStack_eb0 = extraout_XMM0_Qb;
    uStack_ba0 = __umul128(local_1020,b,&local_1048);
    local_630 = (ulong *)(local_e60 + ((ulong)((uint)local_1020 & 0xffff0) ^ 0x10));
    local_b98 = *local_630;
    uStack_b90 = local_630[1];
    local_818 = local_1048;
    local_828 = local_1048;
    local_ba8 = local_1048;
    local_78 = local_b98 ^ local_1048;
    in_stack_ffffffffffffef20 = (__m128i *)(uStack_b90 ^ uStack_ba0);
    local_638 = (long *)(local_e60 + (local_1020 & 0xffff0 ^ 0x20));
    local_98 = *local_638;
    lStack_90 = local_638[1];
    local_1048 = *(ulong *)(local_e60 + (local_1020 & 0xffff0 ^ 0x20)) ^ local_1048;
    uStack_840 = *(ulong *)(local_e60 + (local_1020 & 0xffff0 ^ 0x20) + 8) ^ uStack_ba0;
    local_640 = (long *)(local_e60 + (local_1020 & 0xffff0 ^ 0x30));
    local_58 = *local_640;
    lStack_50 = local_640[1];
    local_250 = (long *)(local_e60 + (local_1020 & 0xffff0 ^ 0x10));
    local_68 = local_ee8;
    uStack_60 = uStack_ee0;
    local_268 = local_58 + local_ee8;
    lStack_260 = lStack_50 + uStack_ee0;
    *local_250 = local_268;
    local_250[1] = lStack_260;
    local_270 = (long *)(local_e60 + (local_1020 & 0xffff0 ^ 0x20));
    local_88 = local_ed8;
    uStack_80 = uStack_ed0;
    local_288 = local_78 + local_ed8;
    lStack_280 = (long)*in_stack_ffffffffffffef20 + uStack_ed0;
    *local_270 = local_288;
    local_270[1] = lStack_280;
    local_290 = (long *)(local_e60 + (local_1020 & 0xffff0 ^ 0x30));
    local_a8 = local_ec8;
    uStack_a0 = uStack_ec0;
    local_2a8 = local_98 + local_ec8;
    lStack_2a0 = lStack_90 + uStack_ec0;
    *local_290 = local_2a8;
    local_290[1] = lStack_2a0;
    local_b8 = local_ec8;
    uStack_b0 = uStack_ec0;
    local_bb8 = local_ec8 + local_1048;
    uStack_bb0 = uStack_ec0 + uStack_840;
    *puVar6 = local_bb8;
    puVar6[1] = uStack_bb0;
    local_1020 = local_bb8 ^ b;
    uStack_ec0 = uStack_bb0 ^ uVar14;
    local_ee8 = local_ed8;
    uStack_ee0 = uStack_ed0;
    local_ed8 = local_ef8;
    uStack_ed0 = uStack_ef0;
    local_528 = local_f18;
    uStack_520 = uStack_f10;
    local_538 = local_f58;
    uStack_530 = uStack_f50;
    local_548 = local_f08;
    uStack_540 = uStack_f00;
    uVar10 = uVar10 ^ local_f08 ^ local_f18 << 0x20;
    local_1118 = (int)local_f58;
    local_1110 = (int)local_f18;
    uVar5 = local_1118 + local_1110 * 2 | 0x80000001;
    local_558 = uStack_f50;
    uStack_550 = 0;
    local_f08 = uStack_f50 / uVar5 & 0xffffffff | uStack_f50 % (ulong)uVar5 << 0x20;
    uStack_ac0 = 0;
    uStack_f00 = 0;
    local_ec8 = local_1020;
    local_bc8 = b;
    uStack_bc0 = uVar14;
    local_ac8 = local_f08;
    local_ab0 = local_f08;
    local_868 = b;
    uStack_860 = uVar14;
    local_858 = b;
    local_850 = uVar14;
    local_848 = local_1048;
    local_838 = local_1048;
    local_830 = uStack_840;
    uStack_820 = uStack_ba0;
    local_810 = uStack_ba0;
    local_518 = local_1020;
    uStack_510 = uStack_ec0;
    local_2c8 = local_bb8;
    uStack_2c0 = uStack_bb0;
    local_2b0 = puVar6;
    local_c8 = local_1048;
    uStack_c0 = uStack_840;
    palStack_70 = in_stack_ffffffffffffef20;
    int_sqrt_v2(local_f58 + local_f08);
    local_f18 = extraout_XMM0_Qa_00;
    uStack_f10 = extraout_XMM0_Qb_00;
    uStack_be0 = __umul128(local_1028,uVar10,&local_1048);
    local_648 = (ulong *)(local_e68 + ((ulong)((uint)local_1028 & 0xffff0) ^ 0x10));
    local_bd8 = *local_648;
    uStack_bd0 = local_648[1];
    local_878 = local_1048;
    local_888 = local_1048;
    local_be8 = local_1048;
    local_f8 = local_bd8 ^ local_1048;
    uStack_f0 = uStack_bd0 ^ uStack_be0;
    local_650 = (long *)(local_e68 + (local_1028 & 0xffff0 ^ 0x20));
    local_118 = *local_650;
    lStack_110 = local_650[1];
    local_1048 = *(ulong *)(local_e68 + (local_1028 & 0xffff0 ^ 0x20)) ^ local_1048;
    uStack_8a0 = *(ulong *)(local_e68 + (local_1028 & 0xffff0 ^ 0x20) + 8) ^ uStack_be0;
    local_658 = (long *)(local_e68 + (local_1028 & 0xffff0 ^ 0x30));
    local_d8 = *local_658;
    lStack_d0 = local_658[1];
    local_2d0 = (long *)(local_e68 + (local_1028 & 0xffff0 ^ 0x10));
    local_e8 = local_f48;
    uStack_e0 = uStack_f40;
    local_2e8 = local_d8 + local_f48;
    lStack_2e0 = lStack_d0 + uStack_f40;
    *local_2d0 = local_2e8;
    local_2d0[1] = lStack_2e0;
    local_2f0 = (long *)(local_e68 + (local_1028 & 0xffff0 ^ 0x20));
    local_108 = local_f38;
    uStack_100 = uStack_f30;
    local_308 = local_f8 + local_f38;
    lStack_300 = uStack_f0 + uStack_f30;
    *local_2f0 = local_308;
    local_2f0[1] = lStack_300;
    local_310 = (long *)(local_e68 + (local_1028 & 0xffff0 ^ 0x30));
    local_128 = local_f28;
    uStack_120 = uStack_f20;
    local_328 = local_118 + local_f28;
    lStack_320 = lStack_110 + uStack_f20;
    *local_310 = local_328;
    local_310[1] = lStack_320;
    local_138 = local_f28;
    uStack_130 = uStack_f20;
    local_bf8 = local_f28 + local_1048;
    uStack_bf0 = uStack_f20 + uStack_8a0;
    *puVar7 = local_bf8;
    puVar7[1] = uStack_bf0;
    local_1028 = local_bf8 ^ uVar10;
    uStack_f20 = uStack_bf0 ^ uVar1;
    local_f48 = local_f38;
    uStack_f40 = uStack_f30;
    local_f38 = local_f58;
    uStack_f30 = uStack_f50;
    local_578 = local_f78;
    uStack_570 = uStack_f70;
    local_588 = local_fb8;
    uStack_580 = uStack_fb0;
    local_598 = local_f68;
    uStack_590 = uStack_f60;
    uVar11 = uVar11 ^ local_f68 ^ local_f78 << 0x20;
    local_1178 = (int)local_fb8;
    local_1170 = (int)local_f78;
    uVar5 = local_1178 + local_1170 * 2 | 0x80000001;
    local_5a8 = uStack_fb0;
    uStack_5a0 = 0;
    local_f68 = uStack_fb0 / uVar5 & 0xffffffff | uStack_fb0 % (ulong)uVar5 << 0x20;
    uStack_ae0 = 0;
    uStack_f60 = 0;
    local_f28 = local_1028;
    local_c08 = uVar10;
    uStack_c00 = uVar1;
    local_ae8 = local_f68;
    local_ad0 = local_f68;
    local_8c8 = uVar10;
    uStack_8c0 = uVar1;
    local_8b8 = uVar10;
    local_8b0 = uVar1;
    local_8a8 = local_1048;
    local_898 = local_1048;
    local_890 = uStack_8a0;
    uStack_880 = uStack_be0;
    local_870 = uStack_be0;
    local_568 = local_1028;
    uStack_560 = uStack_f20;
    local_348 = local_bf8;
    uStack_340 = uStack_bf0;
    local_330 = puVar7;
    local_148 = local_1048;
    uStack_140 = uStack_8a0;
    int_sqrt_v2(local_fb8 + local_f68);
    local_f78 = extraout_XMM0_Qa_01;
    uStack_f70 = extraout_XMM0_Qb_01;
    uStack_c20 = __umul128(local_1030,uVar11,&local_1048);
    local_660 = (ulong *)(local_e70 + ((ulong)((uint)local_1030 & 0xffff0) ^ 0x10));
    local_c18 = *local_660;
    uStack_c10 = local_660[1];
    local_8d8 = local_1048;
    local_8e8 = local_1048;
    local_c28 = local_1048;
    local_178 = local_c18 ^ local_1048;
    uStack_170 = uStack_c10 ^ uStack_c20;
    local_668 = (long *)(local_e70 + (local_1030 & 0xffff0 ^ 0x20));
    local_198 = *local_668;
    lStack_190 = local_668[1];
    local_1048 = *(ulong *)(local_e70 + (local_1030 & 0xffff0 ^ 0x20)) ^ local_1048;
    uStack_900 = *(ulong *)(local_e70 + (local_1030 & 0xffff0 ^ 0x20) + 8) ^ uStack_c20;
    local_670 = (long *)(local_e70 + (local_1030 & 0xffff0 ^ 0x30));
    local_158 = *local_670;
    lStack_150 = local_670[1];
    local_350 = (long *)(local_e70 + (local_1030 & 0xffff0 ^ 0x10));
    local_168 = local_fa8;
    uStack_160 = uStack_fa0;
    local_368 = local_158 + local_fa8;
    lStack_360 = lStack_150 + uStack_fa0;
    *local_350 = local_368;
    local_350[1] = lStack_360;
    local_370 = (long *)(local_e70 + (local_1030 & 0xffff0 ^ 0x20));
    local_188 = local_f98;
    uStack_180 = uStack_f90;
    local_388 = local_178 + local_f98;
    lStack_380 = uStack_170 + uStack_f90;
    *local_370 = local_388;
    local_370[1] = lStack_380;
    local_390 = (long *)(local_e70 + (local_1030 & 0xffff0 ^ 0x30));
    local_1a8 = local_f88;
    uStack_1a0 = uStack_f80;
    local_3a8 = local_198 + local_f88;
    lStack_3a0 = lStack_190 + uStack_f80;
    *local_390 = local_3a8;
    local_390[1] = lStack_3a0;
    local_1b8 = local_f88;
    uStack_1b0 = uStack_f80;
    local_c38 = local_f88 + local_1048;
    uStack_c30 = uStack_f80 + uStack_900;
    *puVar8 = local_c38;
    puVar8[1] = uStack_c30;
    local_1030 = local_c38 ^ uVar11;
    uStack_f80 = uStack_c30 ^ uVar2;
    local_fa8 = local_f98;
    uStack_fa0 = uStack_f90;
    local_f98 = local_fb8;
    uStack_f90 = uStack_fb0;
    local_5c8 = local_fd8;
    uStack_5c0 = uStack_fd0;
    local_5d8 = local_1018;
    uStack_5d0 = uStack_1010;
    local_5e8 = local_fc8;
    uStack_5e0 = uStack_fc0;
    uVar12 = uVar12 ^ local_fc8 ^ local_fd8 << 0x20;
    local_11d8 = (int)local_1018;
    local_11d0 = (int)local_fd8;
    uVar5 = local_11d8 + local_11d0 * 2 | 0x80000001;
    local_5f8 = uStack_1010;
    uStack_5f0 = 0;
    local_fc8 = uStack_1010 / uVar5 & 0xffffffff | uStack_1010 % (ulong)uVar5 << 0x20;
    uStack_b00 = 0;
    uStack_fc0 = 0;
    local_f88 = local_1030;
    local_c48 = uVar11;
    uStack_c40 = uVar2;
    local_b08 = local_fc8;
    local_af0 = local_fc8;
    local_928 = uVar11;
    uStack_920 = uVar2;
    local_918 = uVar11;
    local_910 = uVar2;
    local_908 = local_1048;
    local_8f8 = local_1048;
    local_8f0 = uStack_900;
    uStack_8e0 = uStack_c20;
    local_8d0 = uStack_c20;
    local_5b8 = local_1030;
    uStack_5b0 = uStack_f80;
    local_3c8 = local_c38;
    uStack_3c0 = uStack_c30;
    local_3b0 = puVar8;
    local_1c8 = local_1048;
    uStack_1c0 = uStack_900;
    int_sqrt_v2(local_1018 + local_fc8);
    local_fd8 = extraout_XMM0_Qa_02;
    uStack_fd0 = extraout_XMM0_Qb_02;
    uStack_c60 = __umul128(local_1038,uVar12,&local_1048);
    local_678 = (ulong *)(local_e78 + ((ulong)((uint)local_1038 & 0xffff0) ^ 0x10));
    local_c58 = *local_678;
    uStack_c50 = local_678[1];
    local_938 = local_1048;
    local_948 = local_1048;
    local_c68 = local_1048;
    local_1f8 = local_c58 ^ local_1048;
    uStack_1f0 = uStack_c50 ^ uStack_c60;
    local_680 = (long *)(local_e78 + (local_1038 & 0xffff0 ^ 0x20));
    local_218 = *local_680;
    lStack_210 = local_680[1];
    local_1048 = *(ulong *)(local_e78 + (local_1038 & 0xffff0 ^ 0x20)) ^ local_1048;
    uStack_960 = *(ulong *)(local_e78 + (local_1038 & 0xffff0 ^ 0x20) + 8) ^ uStack_c60;
    local_688 = (long *)(local_e78 + (local_1038 & 0xffff0 ^ 0x30));
    in_stack_ffffffffffffedd8 = *local_688;
    in_stack_ffffffffffffede0 = local_688[1];
    local_3d0 = (long *)(local_e78 + (local_1038 & 0xffff0 ^ 0x10));
    local_1e8 = local_1008;
    uStack_1e0 = uStack_1000;
    local_3e8 = in_stack_ffffffffffffedd8 + local_1008;
    lStack_3e0 = in_stack_ffffffffffffede0 + uStack_1000;
    *local_3d0 = local_3e8;
    local_3d0[1] = lStack_3e0;
    local_3f0 = (long *)(local_e78 + (local_1038 & 0xffff0 ^ 0x20));
    local_208 = local_ff8;
    uStack_200 = uStack_ff0;
    local_408 = local_1f8 + local_ff8;
    lStack_400 = uStack_1f0 + uStack_ff0;
    *local_3f0 = local_408;
    local_3f0[1] = lStack_400;
    local_410 = (long *)(local_e78 + (local_1038 & 0xffff0 ^ 0x30));
    local_228 = local_fe8;
    uStack_220 = uStack_fe0;
    local_428 = local_218 + local_fe8;
    lStack_420 = lStack_210 + uStack_fe0;
    *local_410 = local_428;
    local_410[1] = lStack_420;
    local_238 = local_fe8;
    uStack_230 = uStack_fe0;
    local_c78 = local_fe8 + local_1048;
    uStack_c70 = uStack_fe0 + uStack_960;
    *puVar9 = local_c78;
    puVar9[1] = uStack_c70;
    local_fe8 = local_c78 ^ uVar12;
    uStack_fe0 = uStack_c70 ^ uVar3;
    local_1008 = local_ff8;
    uStack_1000 = uStack_ff0;
    local_ff8 = local_1018;
    uStack_ff0 = uStack_1010;
    local_c88 = uVar12;
    uStack_c80 = uVar3;
    local_988 = uVar12;
    uStack_980 = uVar3;
    local_978 = uVar12;
    local_970 = uVar3;
    local_968 = local_1048;
    local_958 = local_1048;
    local_950 = uStack_960;
    uStack_940 = uStack_c60;
    local_930 = uStack_c60;
    local_608 = local_fe8;
    uStack_600 = uStack_fe0;
    local_448 = local_c78;
    uStack_440 = uStack_c70;
    local_430 = puVar9;
    local_248 = local_1048;
    uStack_240 = uStack_960;
    local_1d8 = in_stack_ffffffffffffedd8;
    lStack_1d0 = in_stack_ffffffffffffede0;
  }
  for (uVar14 = 0; uVar14 < 4; uVar14 = uVar14 + 1) {
    cn_implode_scratchpad<true>(in_stack_ffffffffffffef28,in_stack_ffffffffffffef20);
    keccakf((uint64_t *)local_e30[uVar14],0x18);
    (*extra_hashes[(int)(*(byte *)local_e30[uVar14] & 3)])
              ((uint8_t *)local_e30[uVar14],200,(uint8_t *)(local_e28 + uVar14 * 0x20));
  }
  return;
}

Assistant:

inline void cryptonight_quad_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 4; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint8_t* l3  = ctx[3]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);
    uint64_t* h3 = reinterpret_cast<uint64_t*>(ctx[3]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    CONST_INIT(ctx[3], 3);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2, idx3;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);
    idx3 = _mm_cvtsi128_si64(ax3);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2, *ptr3;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP1(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP2(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP3(3, ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
        CN_STEP4(3, ax3, bx30, bx31, cx3, l3, mc3, ptr3, idx3);
    }

    for (size_t i = 0; i < 4; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}